

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkVertexInputBindingDescription * __thiscall
Fossilize::StateRecorder::Impl::copy<VkVertexInputBindingDescription>
          (Impl *this,VkVertexInputBindingDescription *src,size_t count,ScratchAllocator *alloc)

{
  VkVertexInputBindingDescription *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkVertexInputBindingDescription>(alloc,count);
    if (pVVar1 != (VkVertexInputBindingDescription *)0x0) {
      pVVar1 = (VkVertexInputBindingDescription *)memmove(pVVar1,src,count * 0xc);
      return pVVar1;
    }
  }
  return (VkVertexInputBindingDescription *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}